

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# basisu_containers.h
# Opt level: O0

void __thiscall
basisu::vector<unsigned_char>::reserve(vector<unsigned_char> *this,size_t new_capacity_size_t)

{
  vector<unsigned_char> *other;
  ulong in_RSI;
  vector<unsigned_char> *in_RDI;
  vector<unsigned_char> tmp;
  uint32_t new_capacity;
  undefined8 in_stack_ffffffffffffffb8;
  vector<unsigned_char> *in_stack_ffffffffffffffc8;
  vector<unsigned_char> local_28;
  uint local_14 [5];
  
  if (in_RSI < 0x100000000) {
    local_14[0] = (uint)in_RSI;
    if (in_RDI->m_capacity < local_14[0]) {
      increase_capacity(in_RDI,(uint32_t)((ulong)in_stack_ffffffffffffffb8 >> 0x20),
                        SUB81((ulong)in_stack_ffffffffffffffb8 >> 0x18,0),
                        SUB81((ulong)in_stack_ffffffffffffffb8 >> 0x10,0));
    }
    else if (local_14[0] < in_RDI->m_capacity) {
      vector(&local_28);
      other = (vector<unsigned_char> *)helpers::maximum<unsigned_int>(&in_RDI->m_size,local_14);
      increase_capacity(in_RDI,(uint32_t)((ulong)other >> 0x20),SUB81((ulong)other >> 0x18,0),
                        SUB81((ulong)other >> 0x10,0));
      operator=(in_stack_ffffffffffffffc8,in_RDI);
      swap(in_RDI,other);
      ~vector(in_RDI);
    }
    return;
  }
  __assert_fail("0",
                "/workspace/llm4binary/github/license_c_cmakelists/KhronosGroup[P]KTX-Software/external/basisu/encoder/../transcoder/basisu_containers.h"
                ,0x1e3,"void basisu::vector<unsigned char>::reserve(size_t) [T = unsigned char]");
}

Assistant:

inline void reserve(size_t new_capacity_size_t)
      {
         if (new_capacity_size_t > UINT32_MAX)
         {
            assert(0);
            return;
         }

         uint32_t new_capacity = (uint32_t)new_capacity_size_t;

         if (new_capacity > m_capacity)
            increase_capacity(new_capacity, false);
         else if (new_capacity < m_capacity)
         {
            // Must work around the lack of a "decrease_capacity()" method.
            // This case is rare enough in practice that it's probably not worth implementing an optimized in-place resize.
            vector tmp;
            tmp.increase_capacity(helpers::maximum(m_size, new_capacity), false);
            tmp = *this;
            swap(tmp);
         }
      }